

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  long local_260;
  size_t idx;
  size_t n;
  size_t i;
  int local_240;
  int zeros;
  int k;
  int j;
  char str [512];
  mbedtls_mpi *X_local;
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  bVar1 = true;
  if ((((ssl->conf != (mbedtls_ssl_config *)0x0) &&
       (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
      (X != (mbedtls_mpi *)0x0)) && (level <= debug_threshold)) {
    sVar2 = X->n;
    do {
      n = sVar2;
      idx = n - 1;
      if (idx == 0) break;
      sVar2 = idx;
    } while (X->p[idx] == 0);
    zeros = 0x3f;
    while ((-1 < zeros && ((X->p[idx] >> ((byte)zeros & 0x3f) & 1) == 0))) {
      zeros = zeros + -1;
    }
    str._504_8_ = X;
    snprintf((char *)&k,0x200,"value of \'%s\' (%d bits) is:\n",text,
             (ulong)((int)idx * 0x40 + zeros + 1));
    debug_send_line(ssl,level,file,line,(char *)&k);
    local_260 = 0;
    zeros = 0;
    for (; n != 0; n = n - 1) {
      if ((!bVar1) || (*(long *)(*(long *)(str._504_8_ + 0x10) + (n - 1) * 8) != 0)) {
        for (local_240 = 7; -1 < local_240; local_240 = local_240 + -1) {
          if ((!bVar1) ||
             ((*(ulong *)(*(long *)(str._504_8_ + 0x10) + (n - 1) * 8) >>
               ((byte)(local_240 << 3) & 0x3f) & 0xff) != 0)) {
            bVar1 = false;
            if ((zeros % 0x10 == 0) && (0 < zeros)) {
              snprintf((char *)((long)&k + local_260),0x200 - local_260,anon_var_dwarf_107a2e + 8);
              debug_send_line(ssl,level,file,line,(char *)&k);
              local_260 = 0;
            }
            iVar3 = snprintf((char *)((long)&k + local_260),0x200 - local_260," %02x",
                             (ulong)((uint)(*(ulong *)(*(long *)(str._504_8_ + 0x10) + (n - 1) * 8)
                                           >> ((byte)(local_240 << 3) & 0x3f)) & 0xff));
            local_260 = iVar3 + local_260;
            zeros = zeros + 1;
          }
        }
      }
    }
    if (bVar1) {
      iVar3 = snprintf((char *)((long)&k + local_260),0x200 - local_260," 00");
      local_260 = iVar3 + local_260;
    }
    snprintf((char *)((long)&k + local_260),0x200 - local_260,anon_var_dwarf_107a2e + 8);
    debug_send_line(ssl,level,file,line,(char *)&k);
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_mpi *X )
{
    char str[DEBUG_BUF_SIZE];
    int j, k, zeros = 1;
    size_t i, n, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || X == NULL || level > debug_threshold )
        return;

    for( n = X->n - 1; n > 0; n-- )
        if( X->p[n] != 0 )
            break;

    for( j = ( sizeof(mbedtls_mpi_uint) << 3 ) - 1; j >= 0; j-- )
        if( ( ( X->p[n] >> j ) & 1 ) != 0 )
            break;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "value of '%s' (%d bits) is:\n",
              text, (int) ( ( n * ( sizeof(mbedtls_mpi_uint) << 3 ) ) + j + 1 ) );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    for( i = n + 1, j = 0; i > 0; i-- )
    {
        if( zeros && X->p[i - 1] == 0 )
            continue;

        for( k = sizeof( mbedtls_mpi_uint ) - 1; k >= 0; k-- )
        {
            if( zeros && ( ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF ) == 0 )
                continue;
            else
                zeros = 0;

            if( j % 16 == 0 )
            {
                if( j > 0 )
                {
                    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
                    debug_send_line( ssl, level, file, line, str );
                    idx = 0;
                }
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x", (unsigned int)
                             ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF );

            j++;
        }

    }

    if( zeros == 1 )
        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " 00" );

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
    debug_send_line( ssl, level, file, line, str );
}